

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.cpp
# Opt level: O0

void __thiscall pstore::exchange::import_ns::rule::log_top_impl(rule *this,bool is_push)

{
  bool bVar1;
  int iVar2;
  context *pcVar3;
  size_type depth;
  ostream *poVar4;
  const_reference this_00;
  pointer prVar5;
  undefined4 extraout_var;
  char *t;
  double __x;
  string local_1d8 [32];
  not_null<const_char_*> local_1b8 [3];
  indent local_1a0;
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  *local_198;
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  *stack;
  ostringstream str;
  bool is_push_local;
  rule *this_local;
  
  bVar1 = logging_enabled();
  if (!bVar1) {
    assert_failed("logging_enabled ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_rule.cpp"
                  ,0x55);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack);
  pcVar3 = gsl::not_null<pstore::exchange::import_ns::context_*>::operator->(&this->context_);
  local_198 = &pcVar3->stack;
  depth = std::
          stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
          ::size(local_198);
  anon_unknown.dwarf_594d1d::indent::indent(&local_1a0,depth);
  poVar4 = anon_unknown.dwarf_594d1d::operator<<((ostream *)&stack,&local_1a0);
  poVar4 = std::operator<<(poVar4,(~is_push & 1U) * '\x02' + '+');
  this_00 = std::
            stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
            ::top(local_198);
  prVar5 = std::
           unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
           ::operator->(this_00);
  iVar2 = (*prVar5->_vptr_rule[2])();
  std::operator<<(poVar4,(char *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::ostringstream::str();
  t = (char *)std::__cxx11::string::c_str();
  gsl::not_null<const_char_*>::not_null(local_1b8,t);
  log((pstore *)0x5,__x);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack);
  return;
}

Assistant:

void rule::log_top_impl (bool const is_push) const {
                PSTORE_ASSERT (logging_enabled ());
                std::ostringstream str;
                auto const & stack = context_->stack;
                str << indent{stack.size ()} << (is_push ? '+' : '-') << stack.top ()->name ();
                log (logger::priority::notice, str.str ().c_str ());
            }